

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_fprintdot_unmark(MDD mdd)

{
  ulong *puVar1;
  ulong uVar2;
  
  if (1 < mdd) {
    uVar2 = *(ulong *)(nodes->data + mdd * 0x10);
    if ((uVar2 & 1) != 0) {
      puVar1 = (ulong *)(nodes->data + mdd * 0x10);
      *puVar1 = uVar2 & 0xfffffffffffffffe;
      while( true ) {
        lddmc_fprintdot_unmark(puVar1[1] >> 0x11);
        uVar2 = *puVar1 >> 1 & 0x7fffffffffff;
        if (uVar2 == 0) break;
        puVar1 = (ulong *)(nodes->data + uVar2 * 0x10);
      }
    }
  }
  return;
}

Assistant:

static void
lddmc_fprintdot_unmark(MDD mdd)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) {
        mddnode_setmark(n, 0);
        for (;;) {
            lddmc_fprintdot_unmark(mddnode_getdown(n));
            mdd = mddnode_getright(n);
            if (mdd == lddmc_false) return;
            n = LDD_GETNODE(mdd);
        }
    }
}